

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O1

int __thiscall
Potassco::TheoryData::accept(TheoryData *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  uint uVar1;
  uint id;
  int iVar2;
  TheoryTerm *pTVar3;
  Data *pDVar4;
  TheoryElement *pTVar5;
  long lVar6;
  undefined4 in_register_00000034;
  int *piVar7;
  
  piVar7 = (int *)CONCAT44(in_register_00000034,__fd);
  iVar2 = (int)__addr_len;
  uVar1 = piVar7[1];
  if ((iVar2 == 0) ||
     (((pDVar4 = this->data_, uVar1 < (uint)((pDVar4->terms).top >> 3) &&
       (*(long *)((long)(pDVar4->terms).mem.beg_ + (ulong)uVar1 * 8) != -1)) &&
      ((pDVar4->frame).term <= uVar1)))) {
    pTVar3 = getTerm(this,uVar1);
    pDVar4 = (Data *)(**(code **)(*(long *)__addr + 0x10))(__addr,this,(ulong)uVar1,pTVar3);
  }
  uVar1 = piVar7[2];
  if ((ulong)uVar1 != 0) {
    lVar6 = 0;
    do {
      id = *(uint *)((long)piVar7 + lVar6 + 0xc);
      if ((iVar2 == 0) ||
         (((pDVar4 = this->data_, id < (uint)((pDVar4->elems).top >> 3) &&
           (*(long *)((long)(pDVar4->elems).mem.beg_ + (ulong)id * 8) != 0)) &&
          ((pDVar4->frame).elem <= id)))) {
        pTVar5 = getElement(this,id);
        pDVar4 = (Data *)(**(code **)(*(long *)__addr + 0x18))(__addr,this,(ulong)id,pTVar5);
      }
      lVar6 = lVar6 + 4;
    } while ((ulong)uVar1 << 2 != lVar6);
  }
  if (*piVar7 < 0) {
    uVar1 = piVar7[(ulong)(uint)piVar7[2] + 3];
    if ((iVar2 == 0) ||
       (((pDVar4 = this->data_, uVar1 < (uint)((pDVar4->terms).top >> 3) &&
         (*(long *)((long)(pDVar4->terms).mem.beg_ + (ulong)uVar1 * 8) != -1)) &&
        ((pDVar4->frame).term <= uVar1)))) {
      pTVar3 = getTerm(this,uVar1);
      pDVar4 = (Data *)(**(code **)(*(long *)__addr + 0x10))(__addr,this,(ulong)uVar1,pTVar3);
    }
  }
  if (*piVar7 < 0) {
    uVar1 = piVar7[(ulong)(piVar7[2] + 1) + 3];
    if ((iVar2 == 0) ||
       (((pDVar4 = this->data_, uVar1 < (uint)((pDVar4->terms).top >> 3) &&
         (*(long *)((long)(pDVar4->terms).mem.beg_ + (ulong)uVar1 * 8) != -1)) &&
        ((pDVar4->frame).term <= uVar1)))) {
      pTVar3 = getTerm(this,uVar1);
      iVar2 = (**(code **)(*(long *)__addr + 0x10))
                        (__addr,this,(ulong)uVar1,pTVar3,*(code **)(*(long *)__addr + 0x10));
      return iVar2;
    }
  }
  return (int)pDVar4;
}

Assistant:

void TheoryData::accept(const TheoryAtom& a, Visitor& out, VisitMode m) const {
	if (doVisitTerm(m, a.term())) { out.visit(*this, a.term(), getTerm(a.term())); }
	for (TheoryElement::iterator eIt = a.begin(), eEnd = a.end(); eIt != eEnd; ++eIt) {
		if (doVisitElem(m, *eIt)) { out.visit(*this, *eIt, getElement(*eIt)); }
	}
	if (a.guard() && doVisitTerm(m, *a.guard())) { out.visit(*this, *a.guard(), getTerm(*a.guard())); }
	if (a.rhs() && doVisitTerm(m, *a.rhs()))     { out.visit(*this, *a.rhs(),   getTerm(*a.rhs())); }
}